

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O2

void raviX_hash_table_destroy(HashTable *ht,_func_void_HashEntry_ptr *delete_function)

{
  HashEntry *entry;
  
  if (ht != (HashTable *)0x0) {
    if (delete_function != (_func_void_HashEntry_ptr *)0x0) {
      entry = (HashEntry *)0x0;
      while( true ) {
        entry = raviX_hash_table_next_entry(ht,entry);
        if (entry == (HashEntry *)0x0) break;
        (*delete_function)(entry);
      }
    }
    raviX_free(ht->table);
    raviX_free(ht);
    return;
  }
  return;
}

Assistant:

void
raviX_hash_table_destroy(HashTable *ht,
		   void (*delete_function)(HashEntry *entry))
{
	if (!ht)
		return;

	if (delete_function) {
		HashEntry *entry;

		hash_table_foreach(ht, entry) {
			delete_function(entry);
		}
	}
	raviX_free(ht->table);
	raviX_free(ht);
}